

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O2

void __thiscall
CTcStreamLayout::calc_layout(CTcStreamLayout *this,CTcDataStream *ds,ulong max_len,int is_first)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  CTcStreamAnchor *this_00;
  ulong addr;
  
  if (is_first == 0) {
    if (ds->first_anchor_ == (CTcStreamAnchor *)0x0) {
      return;
    }
    addr = this->page_cnt_ * this->page_size_;
    uVar3 = 0;
  }
  else {
    uVar1 = 0x800;
    do {
      uVar3 = uVar1;
      uVar1 = uVar3 * 2;
    } while (uVar3 < max_len);
    this->page_size_ = uVar3;
    this->page_cnt_ = 1;
    addr = 0;
  }
  this_00 = (CTcStreamAnchor *)&ds->first_anchor_;
  while (this_00 = this_00->nxt_, this_00 != (CTcStreamAnchor *)0x0) {
    if ((this_00->field_0x28 & 1) == 0) {
      uVar2 = CTcStreamAnchor::get_len(this_00,ds);
      if (uVar3 < uVar2) {
        addr = addr + uVar3;
        this->page_cnt_ = this->page_cnt_ + 1;
        uVar3 = this->page_size_;
      }
      CTcStreamAnchor::set_addr(this_00,addr);
      addr = addr + uVar2;
      uVar3 = uVar3 - uVar2;
    }
  }
  if (addr == 0) {
    this->page_cnt_ = 0;
  }
  return;
}

Assistant:

void CTcStreamLayout::calc_layout(CTcDataStream *ds, ulong max_len,
                                  int is_first)
{
    ulong rem;
    ulong free_ofs;
    CTcStreamAnchor *anchor;

    /* if this is the first page, handle some things specially */
    if (is_first)
    {
        ulong pgsiz;

        /* 
         *   Starting at 2k, look for a page size that will fit the
         *   desired minimum size.  
         */
        for (pgsiz = 2048 ; pgsiz < max_len ; pgsiz <<= 1) ;

        /* remember our selected page size */
        page_size_ = pgsiz;

        /* start at the bottom of the first page */
        rem = pgsiz;
        free_ofs = 0;
        page_cnt_ = 1;
    }
    else
    {
        /* 
         *   this isn't the first page - if there are no anchors, don't
         *   bother adding anything 
         */
        if (ds->get_first_anchor() == 0)
            return;

        /* 
         *   start at the end of the last existing page - this will ensure
         *   that everything added from the new stream will go onto a
         *   brand new page after everything from the previous stream 
         */
        rem = 0;
        free_ofs = page_size_ * page_cnt_;
    }
    
    /*
     *   Run through the list of stream anchors and calculate the layout.
     *   For each item, assign its final pool address and apply its
     *   fixups.  
     */
    for (anchor = ds->get_first_anchor() ; anchor != 0 ;
         anchor = anchor->nxt_)
    {
        ulong len;

        /* 
         *   if this anchor has been marked as replaced, don't include it
         *   in our calculations, because we don't want to include this
         *   block in the image file 
         */
        if (anchor->is_replaced())
            continue;
        
        /* 
         *   if this item fits on the current page, assign it the next
         *   sequential address; otherwise, go to the next page
         *   
         *   if this anchor is at the dividing point, put it on the next
         *   page, unless we just started a new page 
         */
        len = anchor->get_len(ds);
        if (len > rem)
        {
            /* 
             *   we must start the next page - skip to the next page by
             *   moving past the remaining free space on this page 
             */
            free_ofs += rem;

            /* count the new page */
            ++page_cnt_;

            /* the whole next page is available to us now */
            rem = page_size_;
        }

        /* 
         *   set the anchor's final address, which will apply fixups for
         *   the object's fixup list 
         */
        anchor->set_addr(free_ofs);

        /* advance past this block */
        free_ofs += len;
        rem -= len;
    }

    /* if there's no data at all, we have zero pages */
    if (free_ofs == 0)
        page_cnt_ = 0;
}